

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O0

ares_status_t ares_hosts_update(ares_channel_t *channel,ares_bool_t use_env)

{
  ares_bool_t aVar1;
  char *local_28;
  char *filename;
  ares_status_t status;
  ares_bool_t use_env_local;
  ares_channel_t *channel_local;
  
  local_28 = (char *)0x0;
  filename._4_4_ = use_env;
  _status = channel;
  filename._0_4_ = ares_hosts_path(channel,use_env,&local_28);
  channel_local._4_4_ = (ares_status_t)filename;
  if ((ares_status_t)filename == ARES_SUCCESS) {
    aVar1 = ares_hosts_expired(local_28,_status->hf);
    if (aVar1 == ARES_FALSE) {
      ares_free(local_28);
      channel_local._4_4_ = ARES_SUCCESS;
    }
    else {
      ares_hosts_file_destroy(_status->hf);
      _status->hf = (ares_hosts_file_t *)0x0;
      filename._0_4_ = ares_parse_hosts(local_28,&_status->hf);
      ares_free(local_28);
      channel_local._4_4_ = (ares_status_t)filename;
    }
  }
  return channel_local._4_4_;
}

Assistant:

static ares_status_t ares_hosts_update(ares_channel_t *channel,
                                       ares_bool_t     use_env)
{
  ares_status_t status;
  char         *filename = NULL;

  status = ares_hosts_path(channel, use_env, &filename);
  if (status != ARES_SUCCESS) {
    return status;
  }

  if (!ares_hosts_expired(filename, channel->hf)) {
    ares_free(filename);
    return ARES_SUCCESS;
  }

  ares_hosts_file_destroy(channel->hf);
  channel->hf = NULL;

  status = ares_parse_hosts(filename, &channel->hf);
  ares_free(filename);
  return status;
}